

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_sse.c
# Opt level: O3

parasail_profile_t *
parasail_profile_create_sse_128_64(char *s1,int _s1Len,parasail_matrix_t *matrix)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  parasail_profile_t *ppVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  long *plVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  
  if (matrix == (parasail_matrix_t *)0x0) {
    parasail_profile_create_sse_128_64_cold_2();
  }
  else if (s1 == (char *)0x0 && matrix->type == 0) {
    parasail_profile_create_sse_128_64_cold_1();
  }
  else {
    if (matrix->type != 0) {
      _s1Len = matrix->length;
    }
    uVar1 = matrix->size;
    uVar8 = (_s1Len - (_s1Len + 1 >> 0x1f)) + 1 >> 1;
    pvVar4 = parasail_memalign(0x10,(long)(int)(uVar8 * uVar1) << 4);
    if ((pvVar4 != (void *)0x0) &&
       (ppVar5 = parasail_profile_new(s1,_s1Len,matrix), ppVar5 != (parasail_profile_t *)0x0)) {
      if (0 < (int)uVar1) {
        uVar7 = 1;
        if (1 < (int)uVar8) {
          uVar7 = (ulong)uVar8;
        }
        uVar9 = 0;
        iVar3 = 0;
        do {
          if (0 < _s1Len) {
            iVar13 = (int)uVar9 * uVar1;
            plVar12 = (long *)((long)iVar3 * 0x10 + (long)pvVar4);
            iVar14 = 0;
            uVar15 = 0;
            do {
              iVar2 = (int)uVar15;
              if (matrix->type == 0) {
                if (iVar2 < _s1Len) {
                  iVar10 = matrix->mapper[(byte)s1[uVar15]] + iVar13;
                  goto LAB_005aa7c6;
                }
LAB_005aa7d3:
                lVar11 = 0;
              }
              else {
                if (_s1Len <= iVar2) goto LAB_005aa7d3;
                iVar10 = matrix->mapper[(byte)matrix->alphabet[uVar9]] + iVar14;
LAB_005aa7c6:
                lVar11 = (long)matrix->matrix[iVar10];
              }
              if (matrix->type == 0) {
                if ((int)(uVar8 + iVar2) < _s1Len) {
                  iVar2 = matrix->mapper[(byte)s1[uVar15 + uVar8]] + iVar13;
                  goto LAB_005aa812;
                }
LAB_005aa81e:
                lVar6 = 0;
              }
              else {
                if (_s1Len <= (int)(uVar8 + iVar2)) goto LAB_005aa81e;
                iVar2 = iVar14 + uVar8 * uVar1 + matrix->mapper[(byte)matrix->alphabet[uVar9]];
LAB_005aa812:
                lVar6 = (long)matrix->matrix[iVar2];
              }
              *plVar12 = lVar11;
              plVar12[1] = lVar6;
              uVar15 = uVar15 + 1;
              plVar12 = plVar12 + 2;
              iVar14 = iVar14 + uVar1;
            } while (uVar7 != uVar15);
            iVar3 = iVar3 + (int)uVar15;
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 != uVar1);
      }
      (ppVar5->profile64).score = pvVar4;
      ppVar5->free = parasail_free___m128i;
      return ppVar5;
    }
  }
  return (parasail_profile_t *)0x0;
}

Assistant:

parasail_profile_t * parasail_profile_create_sse_128_64(
        const char * const restrict s1, const int _s1Len,
        const parasail_matrix_t *matrix)
{
    int s1Len = 0;
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t segNum = 0;
    int32_t n = 0; /* number of amino acids in table */
    const int32_t segWidth = 2; /* number of values in vector unit */
    int32_t segLen = 0;
    __m128i* restrict vProfile = NULL;
    int32_t index = 0;
    parasail_profile_t *profile = NULL;

    PARASAIL_CHECK_NULL(matrix);
    /* s1 is ignored for pssm, required for square */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(s1);
    }

    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    n = matrix->size;
    segLen = (s1Len + segWidth - 1) / segWidth;
    vProfile = parasail_memalign___m128i(16, n * segLen);
    if (!vProfile) return NULL;
    profile = parasail_profile_new(s1, s1Len, matrix);
    if (!profile) return NULL;

    for (k=0; k<n; ++k) {
        for (i=0; i<segLen; ++i) {
            __m128i_64_t t;
            j = i;
            for (segNum=0; segNum<segWidth; ++segNum) {
                if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
                    t.v[segNum] = j >= s1Len ? 0 : matrix->matrix[n*k+matrix->mapper[(unsigned char)s1[j]]];
                }
                else {
                    t.v[segNum] = j >= s1Len ? 0 : matrix->matrix[n*j+matrix->mapper[(unsigned char)matrix->alphabet[k]]];
                }
                j += segLen;
            }
            _mm_store_si128(&vProfile[index], t.m);
            ++index;
        }
    }

    profile->profile64.score = vProfile;
    profile->free = &parasail_free___m128i;
    return profile;
}